

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# commandline.h
# Opt level: O1

void __thiscall
CommandLineOption::CommandLineOption<bool>
          (CommandLineOption *this,bool *data,char shortform,char *longform,char *description)

{
  allocator local_2a;
  allocator local_29;
  
  this->_vptr_CommandLineOption = (_func_int **)&PTR__CommandLineOption_0013f610;
  this->_shortform = shortform;
  std::__cxx11::string::string((string *)&this->_longform,longform,&local_2a);
  std::__cxx11::string::string((string *)&this->_description,description,&local_29);
  this->_type = (type_info *)&bool::typeinfo;
  (this->_ptr).asBool = data;
  if ((shortform == '\0') && (*longform == '\0')) {
    error<>("commandline option left without short-form or long-form name");
  }
  return;
}

Assistant:

CommandLineOption (T& data, char shortform, const char* longform, const char* description) :
		_shortform (shortform),
		_longform (longform),
		_description (description),
		_type (&typeid (T)),
		_ptr (&data)
	{
		static_assert (std::is_same<T, int>::value
			or std::is_same<T, bool>::value
			or std::is_same<T, String>::value
			or std::is_same<T, double>::value
			or std::is_enum<T>::value,
			"value to CommandLineOption must be either int, bool, String or double");

		if (shortform == '\0' and not std::strlen (longform))
			error ("commandline option left without short-form or long-form name");
	}